

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mapper.cpp
# Opt level: O0

bool __thiscall
Mapper::canMapLabel(Mapper *this,string *label,uint instructionIndex,
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   *labelMap,
                   vector<AssemberInstruction,_std::allocator<AssemberInstruction>_> *instructions)

{
  ulong uVar1;
  mapped_type *pmVar2;
  reference pvVar3;
  int local_68;
  uint local_64;
  int i_1;
  int i;
  out_of_range anon_var_0;
  size_t labelIndex;
  vector<AssemberInstruction,_std::allocator<AssemberInstruction>_> *instructions_local;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *labelMap_local;
  uint instructionIndex_local;
  string *label_local;
  Mapper *this_local;
  
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::at(labelMap,label);
  uVar1 = *pmVar2;
  if (uVar1 != instructionIndex) {
    local_64 = instructionIndex;
    if (instructionIndex < uVar1) {
      for (; (ulong)(long)(int)local_64 < uVar1; local_64 = local_64 + 1) {
        pvVar3 = std::vector<AssemberInstruction,_std::allocator<AssemberInstruction>_>::operator[]
                           (instructions,(long)(int)local_64);
        if (pvVar3->length == 0) {
          return false;
        }
      }
    }
    else {
      for (local_68 = instructionIndex - 1; uVar1 <= (ulong)(long)local_68 && 0 < local_68;
          local_68 = local_68 + -1) {
        pvVar3 = std::vector<AssemberInstruction,_std::allocator<AssemberInstruction>_>::operator[]
                           (instructions,(long)local_68);
        if (pvVar3->length == 0) {
          return false;
        }
        if (local_68 == 0) {
          return true;
        }
      }
    }
  }
  return true;
}

Assistant:

bool Mapper::canMapLabel(std::string label, unsigned int instructionIndex, std::unordered_map<std::string, size_t> labelMap,
	std::vector<AssemberInstruction> instructions) {

	size_t labelIndex;
	try {
		labelIndex = labelMap.at(label);
	}
	catch (std::out_of_range) {
		return false;
	}
	if (labelIndex == instructionIndex) {
		return true;
	}
	if (labelIndex > instructionIndex) {
		for (int i = instructionIndex; i < labelIndex; i++) {
			if (!instructions[i].length) {
				return false;
			}
		}
	}
	else {
		for (int i = instructionIndex - 1; i >= labelIndex && i > 0; i--) {
			if (!instructions[i].length) {
				return false;
			}
			if (i == 0)
				return true;
		}
	}
	return true;
}